

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t>::BitpackingScanState
          (BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t> *this,ColumnSegment *segment)

{
  BufferHandle *this_00;
  BufferManager *pBVar1;
  data_ptr_t pdVar2;
  BufferHandle BStack_38;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState =
       (_func_int **)&PTR__BitpackingScanState_01784430;
  this_00 = &this->handle;
  BufferHandle::BufferHandle(this_00);
  this->current_segment = segment;
  this->current_group_offset = 0;
  pBVar1 = BufferManager::GetBufferManager(segment->db);
  (*pBVar1->_vptr_BufferManager[7])(&BStack_38,pBVar1,&segment->block);
  BufferHandle::operator=(this_00,&BStack_38);
  BufferHandle::~BufferHandle(&BStack_38);
  pdVar2 = BufferHandle::Ptr(this_00);
  this->bitpacking_metadata_ptr =
       pdVar2 + *(long *)(pdVar2 + segment->offset) + segment->offset + -4;
  LoadNextGroup(this);
  return;
}

Assistant:

explicit BitpackingScanState(ColumnSegment &segment) : current_segment(segment) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
		handle = buffer_manager.Pin(segment.block);
		auto data_ptr = handle.Ptr();

		// load offset to bitpacking widths pointer
		auto bitpacking_metadata_offset = Load<idx_t>(data_ptr + segment.GetBlockOffset());
		bitpacking_metadata_ptr =
		    data_ptr + segment.GetBlockOffset() + bitpacking_metadata_offset - sizeof(bitpacking_metadata_encoded_t);

		// load the first group
		LoadNextGroup();
	}